

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O2

mraa_result_t mraa_pwm_write_duty(mraa_pwm_context dev,int duty)

{
  _func_mraa_result_t_mraa_pwm_context_float *UNRECOVERED_JUMPTABLE;
  mraa_result_t mVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  uint uVar6;
  char *__fmt;
  char bu [64];
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: write_duty: context is NULL");
    mVar1 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->pwm_write_replace,
       UNRECOVERED_JUMPTABLE != (_func_mraa_result_t_mraa_pwm_context_float *)0x0)) {
      mVar1 = (*UNRECOVERED_JUMPTABLE)(dev,(float)duty);
      return mVar1;
    }
    if ((dev->duty_fp == -1) && (iVar2 = mraa_pwm_setup_duty_fp(dev), iVar2 != 0)) {
      uVar6 = dev->pin;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      __fmt = "pwm%i write_duty: Failed to open duty_cycle for writing: %s";
    }
    else {
      iVar2 = snprintf(bu,0x40,"%d",duty);
      sVar3 = write(dev->duty_fp,bu,(long)iVar2);
      if (sVar3 != -1) {
        return MRAA_SUCCESS;
      }
      uVar6 = dev->pin;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      __fmt = "pwm%i write_duty: Failed to write to duty_cycle: %s";
    }
    syslog(3,__fmt,(ulong)uVar6,pcVar5);
    mVar1 = MRAA_ERROR_INVALID_RESOURCE;
  }
  return mVar1;
}

Assistant:

static mraa_result_t
mraa_pwm_write_duty(mraa_pwm_context dev, int duty)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: write_duty: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, pwm_write_replace)) {
        return dev->advance_func->pwm_write_replace(dev, duty);
    }
    if (dev->duty_fp == -1) {
        if (mraa_pwm_setup_duty_fp(dev) == 1) {
            syslog(LOG_ERR, "pwm%i write_duty: Failed to open duty_cycle for writing: %s", dev->pin, strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    }
    char bu[MAX_SIZE];
    int length = snprintf(bu, MAX_SIZE, "%d", duty);
    if (write(dev->duty_fp, bu, length * sizeof(char)) == -1)
    {
        syslog(LOG_ERR, "pwm%i write_duty: Failed to write to duty_cycle: %s", dev->pin, strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    return MRAA_SUCCESS;
}